

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O0

void __thiscall
OpenMD::Utils::
AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>::
writeErrorBars(AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>
               *this,ostream *stream,string *errorMessage,ErrorHandling errorHandling)

{
  uint uVar1;
  size_t sVar2;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *pvVar3;
  reference pvVar4;
  undefined8 uVar5;
  int in_ECX;
  ostream *in_RSI;
  long in_RDI;
  int i;
  size_t count;
  vector<double,_std::allocator<double>_> err;
  Accumulator<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> local_b8;
  int local_9c;
  Accumulator<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff78;
  Accumulator<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> local_38;
  int local_1c;
  ostream *local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x349ee0);
  sVar2 = Accumulator<std::vector<double,_std::allocator<double>_>_>::getCount
                    ((Accumulator<std::vector<double,_std::allocator<double>_>_> *)(in_RDI + 8));
  if (local_1c == 0) {
    Accumulator<std::vector<double,_std::allocator<double>_>_>::get95percentConfidenceInterval
              (in_stack_ffffffffffffff88);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
  }
  else if (local_1c == 1) {
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getStdDev(in_stack_ffffffffffffff88)
    ;
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
  }
  else if (local_1c == 2) {
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getVariance
              (in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff30);
  }
  local_9c = 0;
  do {
    this_00 = (vector<double,_std::allocator<double>_> *)(long)local_9c;
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getAverage
              (in_stack_ffffffffffffff18);
    pvVar3 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(&local_b8);
    std::vector<double,_std::allocator<double>_>::~vector(this_00);
    if (pvVar3 <= this_00) {
      std::vector<double,_std::allocator<double>_>::~vector(this_00);
      return;
    }
    if ((sVar2 == 0) && (local_1c == 0)) {
      std::operator<<(local_10,"\t");
    }
    else {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_9c);
      uVar1 = std::isinf(*pvVar4);
      if ((uVar1 & 1) == 0) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)local_9c);
        uVar1 = std::isnan(*pvVar4);
        if ((uVar1 & 1) == 0) {
          if (sVar2 == 0) {
            std::operator<<(local_10,"\t");
          }
          else {
            in_stack_ffffffffffffff18 =
                 (Accumulator<std::vector<double,_std::allocator<double>_>_> *)
                 std::operator<<(local_10,"\t");
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_38,(long)local_9c);
            std::ostream::operator<<(in_stack_ffffffffffffff18,*pvVar4);
          }
          goto LAB_0034a15f;
        }
      }
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"%s",uVar5);
      painCave.isFatal = 1;
      simError();
    }
LAB_0034a15f:
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      std::vector<RealType> err;
      std::size_t count = StdVectorAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = StdVectorAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = StdVectorAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = StdVectorAccumulator::getVariance();
        break;
      default:
        break;
      }

      for (int i = 0; i < StdVectorAccumulator::getAverage().size(); i++) {
        if (count == 0 && errorHandling == ErrorHandling::CI95) {
          stream << "\t";
        } else {
          if (std::isinf(err[i]) || std::isnan(err[i])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                     errorMessage.c_str());
            painCave.isFatal = 1;
            simError();
          } else {
            if (count == 0)
              stream << "\t";
            else
              stream << "\t" << err[i];
          }
        }
      }
    }